

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O3

task_handle __thiscall
oqpi::scheduler<concurrent_queue>::add(scheduler<concurrent_queue> *this,task_handle *hTask)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  task_priority tVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_> *upWorker;
  element_type *peVar5;
  task_handle tVar6;
  
  _Var4._M_pi = in_RDX;
  if ((((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
      super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != (element_type *)0x0
     ) {
    task_handle::validate((task_handle *)in_RDX);
    _Var4._M_pi = extraout_RDX;
    if (((((((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
           super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->grabbed_).
         _M_base._M_i & 1U) == 0) {
      task_handle::validate((task_handle *)in_RDX);
      _Var4._M_pi = extraout_RDX_00;
      if (((((((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
             super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->done_).
           _M_base._M_i & 1U) == 0) {
        tVar3 = resolveTaskPriority((scheduler<concurrent_queue> *)hTask,(task_handle *)in_RDX);
        concurrent_queue<oqpi::task_handle>::push
                  ((concurrent_queue<oqpi::task_handle> *)((long)hTask + (ulong)tVar3 * 0x78 + 0x30)
                   ,(task_handle *)in_RDX);
        peVar5 = (hTask->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar1 = (element_type *)
                 (hTask->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        _Var4._M_pi = extraout_RDX_01;
        if (peVar5 != peVar1) {
          do {
            if ((*(uint *)(peVar5->_vptr_task_base + 8) & 1 << (tVar3 & 0x1f)) != 0) {
              (**(code **)(*peVar5->_vptr_task_base + 0x38))();
              _Var4._M_pi = extraout_RDX_02;
            }
            peVar5 = (element_type *)&peVar5->uid_;
          } while (peVar5 != peVar1);
        }
      }
    }
  }
  peVar5 = (((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
           super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDX->_M_use_count)->_M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDX->_M_use_count)->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar5;
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2;
  (((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
  super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  tVar6.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  tVar6.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (task_handle)tVar6.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

task_handle add(task_handle hTask)
        {
            if (hTask.isValid() && !hTask.isGrabbed() && !hTask.isDone())
            {
                const auto priority = resolveTaskPriority(hTask);
                pendingTasks_[int(priority)].push(hTask);
                wakeUpWorkersWithPriority(priority);
            }
            return hTask;
        }